

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbarinfo.cpp
# Opt level: O1

int __thiscall SBarInfo::newImage(SBarInfo *this,char *patchname)

{
  FString *pFVar1;
  int iVar2;
  ulong uVar3;
  uint uVar4;
  ulong uVar5;
  bool bVar6;
  FString FStack_38;
  
  uVar4 = 0xffffffff;
  if ((*patchname != '\0') && (iVar2 = strcasecmp(patchname,"nullimage"), iVar2 != 0)) {
    uVar3 = (ulong)(this->Images).Count;
    bVar6 = uVar3 != 0;
    if (bVar6) {
      pFVar1 = (this->Images).Array;
      iVar2 = strcasecmp(pFVar1->Chars,patchname);
      if (iVar2 == 0) {
        uVar5 = 0;
      }
      else {
        uVar5 = 0;
        do {
          if (uVar3 - 1 == uVar5) goto LAB_004c0d87;
          iVar2 = strcasecmp(pFVar1[uVar5 + 1].Chars,patchname);
          uVar5 = uVar5 + 1;
        } while (iVar2 != 0);
        bVar6 = uVar5 < uVar3;
      }
      if (bVar6) {
        return (int)uVar5;
      }
    }
LAB_004c0d87:
    FString::FString(&FStack_38,patchname);
    TArray<FString,_FString>::Grow(&this->Images,1);
    FString::AttachToOther((this->Images).Array + (this->Images).Count,&FStack_38);
    uVar4 = (this->Images).Count;
    (this->Images).Count = uVar4 + 1;
    FString::~FString(&FStack_38);
  }
  return uVar4;
}

Assistant:

int SBarInfo::newImage(const char *patchname)
{
	if(patchname[0] == '\0' || stricmp(patchname, "nullimage") == 0)
	{
		return -1;
	}
	for(unsigned int i = 0;i < this->Images.Size();i++) //did we already load it?
	{
		if(stricmp(this->Images[i], patchname) == 0)
		{
			return i;
		}
	}
	return this->Images.Push(patchname);
}